

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

int Lf_ManFindCofVar(word *pTruth,int nWords,int nVars)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  ulong *puVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  word *pwVar12;
  ulong uVar13;
  ulong *puVar14;
  int v;
  ulong uVar15;
  ulong uVar16;
  ulong local_438 [123];
  word *pLimit;
  word *tLimit;
  
  if (nVars < 1) {
    return -1;
  }
  iVar10 = nVars + -6;
  uVar7 = 1 << ((byte)iVar10 & 0x1f);
  uVar1 = uVar7;
  if ((int)uVar7 < 2) {
    uVar1 = 1;
  }
  uVar16 = (ulong)(uint)nVars;
  uVar9 = 0;
LAB_0075f48c:
  bVar3 = (byte)uVar9;
  if (nWords == 1) {
    local_438[0] = (s_Truths6Neg[uVar9] & *pTruth) << ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) |
                   s_Truths6Neg[uVar9] & *pTruth;
  }
  else if (uVar9 < 6) {
    if (0 < nWords) {
      uVar15 = s_Truths6Neg[uVar9];
      uVar13 = 0;
      do {
        local_438[uVar13] =
             (pTruth[uVar13] & uVar15) << ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) |
             pTruth[uVar13] & uVar15;
        uVar13 = uVar13 + 1;
      } while ((uint)nWords != uVar13);
    }
  }
  else if (0 < nWords) {
    bVar2 = (byte)(uVar9 - 6);
    uVar6 = 1 << (bVar2 & 0x1f);
    iVar11 = 2 << (bVar2 & 0x1f);
    uVar15 = 1;
    if (1 < (int)uVar6) {
      uVar15 = (ulong)uVar6;
    }
    puVar14 = local_438 + (int)uVar6;
    puVar4 = local_438;
    pwVar12 = pTruth;
    do {
      if (uVar9 - 6 != 0x1f) {
        uVar13 = 0;
        do {
          uVar5 = pwVar12[uVar13];
          puVar4[uVar13] = uVar5;
          puVar14[uVar13] = uVar5;
          uVar13 = uVar13 + 1;
        } while (uVar15 != uVar13);
      }
      pwVar12 = pwVar12 + iVar11;
      puVar14 = puVar14 + iVar11;
      puVar4 = puVar4 + iVar11;
    } while (pwVar12 < pTruth + nWords);
  }
  uVar15 = 0;
  uVar6 = 0;
  do {
    if (nVars < 7) {
      uVar8 = (uint)((s_Truths6Neg[uVar15] &
                     (local_438[0] >> ((byte)(1 << ((byte)uVar15 & 0x1f)) & 0x3f) ^ local_438[0]))
                    != 0);
    }
    else {
      uVar8 = 0;
      if (uVar15 < 6) {
        if (iVar10 != 0x1f) {
          uVar13 = 0;
          do {
            if (((local_438[uVar13] >> ((byte)(1 << ((byte)uVar15 & 0x1f)) & 0x3f) ^
                 local_438[uVar13]) & s_Truths6Neg[uVar15]) != 0) {
              uVar8 = 1;
              break;
            }
            uVar13 = uVar13 + 1;
          } while (uVar1 != uVar13);
        }
      }
      else if (iVar10 != 0x1f) {
        bVar2 = (byte)(uVar15 - 6);
        uVar8 = 1 << (bVar2 & 0x1f);
        iVar11 = 2 << (bVar2 & 0x1f);
        uVar13 = 1;
        if (1 < (int)uVar8) {
          uVar13 = (ulong)uVar8;
        }
        puVar14 = local_438 + (int)uVar8;
        puVar4 = local_438;
        do {
          if (uVar15 - 6 != 0x1f) {
            uVar5 = 0;
            do {
              if (puVar4[uVar5] != puVar14[uVar5]) {
                uVar8 = 1;
                goto LAB_0075f5ab;
              }
              uVar5 = uVar5 + 1;
            } while (uVar13 != uVar5);
          }
          puVar4 = puVar4 + iVar11;
          puVar14 = puVar14 + iVar11;
          uVar8 = 0;
        } while (puVar4 < local_438 + (int)uVar7);
      }
    }
LAB_0075f5ab:
    uVar6 = uVar6 + uVar8;
    uVar15 = uVar15 + 1;
  } while (uVar15 != uVar16);
  if (1 < uVar6) {
    if (nWords == 1) {
      local_438[0] = (s_Truths6[uVar9] & *pTruth) >> ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) |
                     s_Truths6[uVar9] & *pTruth;
    }
    else if (uVar9 < 6) {
      if (0 < nWords) {
        uVar15 = s_Truths6[uVar9];
        uVar13 = 0;
        do {
          local_438[uVar13] =
               (pTruth[uVar13] & uVar15) >> ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) |
               pTruth[uVar13] & uVar15;
          uVar13 = uVar13 + 1;
        } while ((uint)nWords != uVar13);
      }
    }
    else if (0 < nWords) {
      bVar3 = (byte)(uVar9 - 6);
      uVar6 = 1 << (bVar3 & 0x1f);
      iVar11 = 2 << (bVar3 & 0x1f);
      uVar15 = 1;
      if (1 < (int)uVar6) {
        uVar15 = (ulong)uVar6;
      }
      puVar4 = local_438;
      pwVar12 = pTruth;
      do {
        if (uVar9 - 6 != 0x1f) {
          uVar13 = 0;
          do {
            uVar5 = pwVar12[(long)(int)uVar6 + uVar13];
            puVar4[uVar13] = uVar5;
            puVar4[(long)(int)uVar6 + uVar13] = uVar5;
            uVar13 = uVar13 + 1;
          } while (uVar15 != uVar13);
        }
        pwVar12 = pwVar12 + iVar11;
        puVar4 = puVar4 + iVar11;
      } while (pwVar12 < pTruth + nWords);
    }
    uVar15 = 0;
    uVar6 = 0;
LAB_0075f7a0:
    if (nVars < 7) {
      uVar8 = (uint)((s_Truths6Neg[uVar15] &
                     (local_438[0] >> ((byte)(1 << ((byte)uVar15 & 0x1f)) & 0x3f) ^ local_438[0]))
                    != 0);
    }
    else {
      uVar8 = 0;
      if (uVar15 < 6) {
        if (iVar10 != 0x1f) {
          uVar13 = 0;
          do {
            if (((local_438[uVar13] >> ((byte)(1 << ((byte)uVar15 & 0x1f)) & 0x3f) ^
                 local_438[uVar13]) & s_Truths6Neg[uVar15]) != 0) goto LAB_0075f877;
            uVar13 = uVar13 + 1;
            uVar8 = 0;
          } while (uVar1 != uVar13);
        }
      }
      else if (iVar10 != 0x1f) {
        bVar3 = (byte)(uVar15 - 6);
        uVar8 = 1 << (bVar3 & 0x1f);
        iVar11 = 2 << (bVar3 & 0x1f);
        uVar13 = 1;
        if (1 < (int)uVar8) {
          uVar13 = (ulong)uVar8;
        }
        puVar14 = local_438 + (int)uVar8;
        puVar4 = local_438;
        do {
          if (uVar15 - 6 != 0x1f) {
            uVar5 = 0;
            do {
              if (puVar4[uVar5] != puVar14[uVar5]) goto LAB_0075f877;
              uVar5 = uVar5 + 1;
            } while (uVar13 != uVar5);
          }
          puVar4 = puVar4 + iVar11;
          puVar14 = puVar14 + iVar11;
          uVar8 = 0;
        } while (puVar4 < local_438 + (int)uVar7);
      }
    }
    goto LAB_0075f883;
  }
  goto LAB_0075f89b;
LAB_0075f877:
  uVar8 = 1;
LAB_0075f883:
  uVar6 = uVar6 + uVar8;
  uVar15 = uVar15 + 1;
  if (uVar15 == uVar16) goto code_r0x0075f891;
  goto LAB_0075f7a0;
code_r0x0075f891:
  if (1 < uVar6) {
    return (int)uVar9;
  }
LAB_0075f89b:
  uVar9 = uVar9 + 1;
  if (uVar9 == uVar16) {
    return -1;
  }
  goto LAB_0075f48c;
}

Assistant:

static inline int Lf_ManFindCofVar( word * pTruth, int nWords, int nVars )
{
    word uTruthCof[LF_TT_WORDS]; int iVar;
    for ( iVar = 0; iVar < nVars; iVar++ )
    {
        Abc_TtCofactor0p( uTruthCof, pTruth, nWords, iVar );
        if ( Abc_TtSupportSize(uTruthCof, nVars) < 2 )
            continue;
        Abc_TtCofactor1p( uTruthCof, pTruth, nWords, iVar );
        if ( Abc_TtSupportSize(uTruthCof, nVars) < 2 )
            continue;
        return iVar;
    }
    return -1;
}